

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiber.c
# Opt level: O3

sx_coro_context * sx_coro_create_context(sx_alloc *alloc,int num_initial_fibers,int stack_sz)

{
  code *pcVar1;
  sx_coro_context *psVar2;
  size_t sVar3;
  sx_pool *psVar4;
  ulong uVar5;
  long lVar6;
  sx__pool_page *__s;
  long lVar7;
  uint uVar8;
  
  if (num_initial_fibers < 1) {
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/fiber.c",
                      0xaa,"num_initial_fibers > 0");
    pcVar1 = (code *)swi(3);
    psVar2 = (sx_coro_context *)(*pcVar1)();
    return psVar2;
  }
  sVar3 = sx_os_minstacksz();
  if ((ulong)(long)stack_sz < sVar3) {
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/fiber.c",
                      0xab,"stack size too small");
    pcVar1 = (code *)swi(3);
    psVar2 = (sx_coro_context *)(*pcVar1)();
    return psVar2;
  }
  psVar2 = (sx_coro_context *)
           (*alloc->alloc_cb)((void *)0x0,0x30,0,(char *)0x0,(char *)0x0,0,alloc->user_data);
  if (psVar2 == (sx_coro_context *)0x0) {
    sx__mem_run_fail_callback
              ("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/fiber.c",0xaf);
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/fiber.c",
                      0xaf,"Out of memory");
    pcVar1 = (code *)swi(3);
    psVar2 = (sx_coro_context *)(*pcVar1)();
    return psVar2;
  }
  psVar2->run_list_last = (sx__coro_state *)0x0;
  psVar2->cur_coro = (sx__coro_state *)0x0;
  psVar2->coro_pool = (sx_pool *)0x0;
  psVar2->run_list = (sx__coro_state *)0x0;
  *(undefined8 *)&psVar2->stack_sz = 0;
  psVar2->alloc = alloc;
  uVar8 = num_initial_fibers + 0xfU & 0xfffffff0;
  lVar7 = (long)(int)uVar8;
  psVar4 = (sx_pool *)
           (*alloc->alloc_cb)((void *)0x0,lVar7 * 0x58 | 0x30,0x10,
                              "/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/fiber.c"
                              ,"sx_coro_context *sx_coro_create_context(const sx_alloc *, int, int)"
                              ,0xb6,alloc->user_data);
  if (psVar4 != (sx_pool *)0x0) {
    psVar4->item_sz = 0x50;
    psVar4->capacity = uVar8;
    psVar4->pages = (sx__pool_page *)(psVar4 + 1);
    *(uint *)&psVar4[2].pages = uVar8;
    *(sx_pool **)(psVar4 + 1) = psVar4 + 3;
    __s = (sx__pool_page *)(&psVar4[3].item_sz + lVar7 * 2);
    psVar4[1].pages = __s;
    psVar4[2].item_sz = 0;
    psVar4[2].capacity = 0;
    if (0 < (int)uVar8) {
      uVar5 = (ulong)uVar8;
      lVar6 = 0;
      do {
        lVar7 = lVar7 + -1;
        *(long *)(*(long *)(psVar4 + 1) + lVar7 * 8) = (long)&(psVar4[1].pages)->ptrs + lVar6;
        lVar6 = lVar6 + 0x50;
        uVar5 = uVar5 - 1;
      } while (uVar5 != 0);
      __s = psVar4[1].pages;
    }
    memset(__s,0,(long)(int)(uVar8 * 0x50));
    psVar2->coro_pool = psVar4;
    psVar2->stack_sz = stack_sz;
    return psVar2;
  }
  sx__mem_run_fail_callback
            ("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/include/sx/pool.h",0x5b)
  ;
  sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/include/sx/pool.h"
                    ,0x5b,"Out of memory");
  pcVar1 = (code *)swi(3);
  psVar2 = (sx_coro_context *)(*pcVar1)();
  return psVar2;
}

Assistant:

sx_coro_context* sx_coro_create_context(const sx_alloc* alloc, int num_initial_fibers, int stack_sz)
{
    sx_assert(num_initial_fibers > 0);
    sx_assertf((size_t)stack_sz >= sx_os_minstacksz(), "stack size too small");

    sx_coro_context* ctx = (sx_coro_context*)sx_malloc(alloc, sizeof(sx_coro_context));
    if (!ctx) {
        sx_out_of_memory();
        return NULL;
    }
    sx_memset(ctx, 0x0, sizeof(sx_coro_context));

    ctx->alloc = alloc;

    ctx->coro_pool = sx_pool_create(alloc, sizeof(sx__coro_state), num_initial_fibers);
    if (!ctx->coro_pool) {
        sx_out_of_memory();
        return NULL;
    }
    ctx->stack_sz = stack_sz;

    return ctx;
}